

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::add<std::__cxx11::string>
          (parser *this,string *name,char short_name,string *desc,bool need,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  undefined8 in_RCX;
  char in_DL;
  undefined8 in_RSI;
  parser *in_RDI;
  byte in_R8B;
  string *in_R9;
  string local_50 [47];
  byte local_21;
  
  local_21 = in_R8B & 1;
  std::__cxx11::string::string(local_50,in_R9);
  add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
            (in_RDI,in_RSI,(int)in_DL,in_RCX,in_R8B & 1,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "", bool need = true,
             const T def = T()) {
        add(name, short_name, desc, need, def, default_reader<T>());
    }